

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack8to4.h
# Opt level: O0

void ncnn::deconvolution_pack8to4_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  long lVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  int iVar90;
  int iVar91;
  undefined8 *puVar92;
  long lVar93;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar98 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  long *in_stack_00000030;
  __m128 _w7;
  __m128 _w6;
  __m128 _w5;
  __m128 _w4;
  __m128 _w3;
  __m128 _w2;
  __m128 _w1;
  __m128 _w0;
  __m128 _val7;
  __m128 _val6;
  __m128 _val5;
  __m128 _val4;
  __m128 _val3;
  __m128 _val2;
  __m128 _val1;
  __m128 _val0;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m128 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y_1;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_4;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_3;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  int local_2898;
  int local_288c;
  int local_283c;
  long local_27f0;
  undefined8 local_27e8;
  undefined8 uStack_27e0;
  int local_27d4;
  int local_27d0;
  undefined8 *local_2760;
  int local_2754;
  undefined1 local_2168 [8];
  undefined8 uStack_2160;
  ulong uStack_2100;
  float local_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float local_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  float local_1fb8;
  float fStack_1fb4;
  float fStack_1fb0;
  float fStack_1fac;
  float local_1f98;
  float fStack_1f94;
  float fStack_1f90;
  float fStack_1f8c;
  float local_1f78;
  float fStack_1f74;
  float fStack_1f70;
  float fStack_1f6c;
  float local_1f58;
  float fStack_1f54;
  float fStack_1f50;
  float fStack_1f4c;
  float local_1f38;
  float fStack_1f34;
  float fStack_1f30;
  float fStack_1f2c;
  float local_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float local_1ef8;
  float fStack_1ef4;
  float fStack_1ef0;
  float fStack_1eec;
  float local_1e28;
  float fStack_1e24;
  float fStack_1e20;
  float fStack_1e1c;
  float local_1e18;
  float fStack_1e14;
  float fStack_1e10;
  float fStack_1e0c;
  ulong uStack_1cd0;
  float local_1c58;
  float fStack_1c54;
  float fStack_1c50;
  float fStack_1c4c;
  float fStack_1c40;
  float fStack_1c3c;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  float local_1ba8;
  float fStack_1ba4;
  float local_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16e8;
  float fStack_16e4;
  float fStack_16e0;
  float fStack_16dc;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  float local_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float local_ee8;
  float fStack_ee4;
  float fStack_ee0;
  float fStack_edc;
  float local_ec8;
  float fStack_ec4;
  float fStack_ec0;
  float fStack_ebc;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_758;
  undefined8 uStack_750;
  ulong uStack_700;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  
  lVar86 = in_RSI[7];
  lVar9 = *in_RCX;
  for (local_2754 = 0; local_2754 < (int)lVar86; local_2754 = local_2754 + 1) {
    local_2760 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_2754 * in_RSI[2]);
    iVar7 = *(int *)((long)in_RDI + 0x2c);
    lVar87 = in_RDI[6];
    lVar88 = in_RDI[7];
    iVar8 = *(int *)((long)in_RSI + 0x2c);
    lVar89 = in_RSI[6];
    for (local_27d0 = 0; local_27d0 < (int)lVar89; local_27d0 = local_27d0 + 1) {
      for (local_27d4 = 0; local_27d4 < iVar8; local_27d4 = local_27d4 + 1) {
        local_27e8 = 0;
        uStack_27e0 = 0;
        if (lVar9 != 0) {
          puVar92 = (undefined8 *)(lVar9 + (long)(local_2754 << 2) * 4);
          local_27e8 = *puVar92;
          uStack_27e0 = puVar92[1];
        }
        local_27f0 = *in_RDX + in_RDX[8] * (long)local_2754 * in_RDX[2];
        for (local_283c = 0; local_283c < (int)lVar88; local_283c = local_283c + 1) {
          for (local_288c = 0; local_288c < in_R9D; local_288c = local_288c + 1) {
            iVar90 = (local_27d0 + local_288c * in_stack_00000010) -
                     in_stack_00000010 * (in_R9D + -1);
            if (((-1 < iVar90) && (iVar90 % in_stack_00000020 == 0)) &&
               (iVar90 / in_stack_00000020 < (int)lVar87)) {
              for (local_2898 = 0; local_2898 < in_R8D; local_2898 = local_2898 + 1) {
                iVar91 = (local_27d4 + local_2898 * in_stack_00000008) -
                         in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar91) && (iVar91 % in_stack_00000018 == 0)) &&
                   (iVar91 / in_stack_00000018 < iVar7)) {
                  pfVar1 = (float *)(*in_RDI + in_RDI[8] * (long)local_283c * in_RDI[2] +
                                     (long)*(int *)((long)in_RDI + 0x2c) *
                                     (long)(iVar90 / in_stack_00000020) * in_RDI[2] +
                                    (long)(iVar91 / in_stack_00000018 << 3) * 4);
                  iVar91 = (local_288c * in_R8D + local_2898) * 0x20;
                  fVar94 = *pfVar1;
                  fVar95 = pfVar1[1];
                  fVar96 = pfVar1[2];
                  fVar97 = pfVar1[3];
                  fVar2 = pfVar1[4];
                  fVar3 = pfVar1[5];
                  fVar4 = pfVar1[6];
                  fVar5 = pfVar1[7];
                  puVar92 = (undefined8 *)(local_27f0 + (long)iVar91 * 4);
                  uVar14 = *puVar92;
                  uVar15 = puVar92[1];
                  lVar93 = local_27f0 + (long)iVar91 * 4;
                  uVar16 = *(undefined8 *)(lVar93 + 0x10);
                  uVar17 = *(undefined8 *)(lVar93 + 0x18);
                  lVar93 = local_27f0 + (long)iVar91 * 4;
                  uVar18 = *(undefined8 *)(lVar93 + 0x20);
                  uVar19 = *(undefined8 *)(lVar93 + 0x28);
                  lVar93 = local_27f0 + (long)iVar91 * 4;
                  uVar20 = *(undefined8 *)(lVar93 + 0x30);
                  uVar21 = *(undefined8 *)(lVar93 + 0x38);
                  lVar93 = local_27f0 + (long)iVar91 * 4;
                  uVar22 = *(undefined8 *)(lVar93 + 0x40);
                  uVar23 = *(undefined8 *)(lVar93 + 0x48);
                  lVar93 = local_27f0 + (long)iVar91 * 4;
                  uVar24 = *(undefined8 *)(lVar93 + 0x50);
                  uVar25 = *(undefined8 *)(lVar93 + 0x58);
                  lVar93 = local_27f0 + (long)iVar91 * 4;
                  uVar26 = *(undefined8 *)(lVar93 + 0x60);
                  uVar27 = *(undefined8 *)(lVar93 + 0x68);
                  lVar93 = local_27f0 + (long)iVar91 * 4;
                  uVar28 = *(undefined8 *)(lVar93 + 0x70);
                  uVar29 = *(undefined8 *)(lVar93 + 0x78);
                  local_1fd8 = (float)uVar14;
                  fStack_1fd4 = (float)((ulong)uVar14 >> 0x20);
                  fStack_1fd0 = (float)uVar15;
                  fStack_1fcc = (float)((ulong)uVar15 >> 0x20);
                  local_20d8 = (float)local_27e8;
                  fStack_20d4 = (float)((ulong)local_27e8 >> 0x20);
                  fStack_20d0 = (float)uStack_27e0;
                  fStack_20cc = (float)((ulong)uStack_27e0 >> 0x20);
                  local_1fb8 = (float)uVar16;
                  fStack_1fb4 = (float)((ulong)uVar16 >> 0x20);
                  fStack_1fb0 = (float)uVar17;
                  fStack_1fac = (float)((ulong)uVar17 >> 0x20);
                  local_1f98 = (float)uVar18;
                  fStack_1f94 = (float)((ulong)uVar18 >> 0x20);
                  fStack_1f90 = (float)uVar19;
                  fStack_1f8c = (float)((ulong)uVar19 >> 0x20);
                  local_1f78 = (float)uVar20;
                  fStack_1f74 = (float)((ulong)uVar20 >> 0x20);
                  fStack_1f70 = (float)uVar21;
                  fStack_1f6c = (float)((ulong)uVar21 >> 0x20);
                  local_1f58 = (float)uVar22;
                  fStack_1f54 = (float)((ulong)uVar22 >> 0x20);
                  fStack_1f50 = (float)uVar23;
                  fStack_1f4c = (float)((ulong)uVar23 >> 0x20);
                  local_1f38 = (float)uVar24;
                  fStack_1f34 = (float)((ulong)uVar24 >> 0x20);
                  fStack_1f30 = (float)uVar25;
                  fStack_1f2c = (float)((ulong)uVar25 >> 0x20);
                  local_1f18 = (float)uVar26;
                  fStack_1f14 = (float)((ulong)uVar26 >> 0x20);
                  fStack_1f10 = (float)uVar27;
                  fStack_1f0c = (float)((ulong)uVar27 >> 0x20);
                  local_1ef8 = (float)uVar28;
                  fStack_1ef4 = (float)((ulong)uVar28 >> 0x20);
                  fStack_1ef0 = (float)uVar29;
                  fStack_1eec = (float)((ulong)uVar29 >> 0x20);
                  local_27e8 = CONCAT44(fVar5 * fStack_1ef4 +
                                        fVar4 * fStack_1f14 +
                                        fVar3 * fStack_1f34 +
                                        fVar2 * fStack_1f54 +
                                        fVar97 * fStack_1f74 +
                                        fVar96 * fStack_1f94 +
                                        fVar95 * fStack_1fb4 + fVar94 * fStack_1fd4 + fStack_20d4,
                                        fVar5 * local_1ef8 +
                                        fVar4 * local_1f18 +
                                        fVar3 * local_1f38 +
                                        fVar2 * local_1f58 +
                                        fVar97 * local_1f78 +
                                        fVar96 * local_1f98 +
                                        fVar95 * local_1fb8 + fVar94 * local_1fd8 + local_20d8);
                  uStack_27e0 = CONCAT44(fVar5 * fStack_1eec +
                                         fVar4 * fStack_1f0c +
                                         fVar3 * fStack_1f2c +
                                         fVar2 * fStack_1f4c +
                                         fVar97 * fStack_1f6c +
                                         fVar96 * fStack_1f8c +
                                         fVar95 * fStack_1fac + fVar94 * fStack_1fcc + fStack_20cc,
                                         fVar5 * fStack_1ef0 +
                                         fVar4 * fStack_1f10 +
                                         fVar3 * fStack_1f30 +
                                         fVar2 * fStack_1f50 +
                                         fVar97 * fStack_1f70 +
                                         fVar96 * fStack_1f90 +
                                         fVar95 * fStack_1fb0 + fVar94 * fStack_1fd0 + fStack_20d0);
                }
              }
            }
          }
          local_27f0 = local_27f0 + (long)(in_R8D * in_R9D * 0x20) * 4;
        }
        fStack_1c40 = (float)uStack_27e0;
        fStack_1c3c = (float)((ulong)uStack_27e0 >> 0x20);
        local_1ba8 = (float)local_27e8;
        fStack_1ba4 = (float)((ulong)local_27e8 >> 0x20);
        switch(in_stack_00000028) {
        case 1:
          uStack_2100 = SUB168(ZEXT816(0),4);
          auVar30._8_8_ = uStack_27e0;
          auVar30._0_8_ = local_27e8;
          auVar82._8_8_ = 0;
          auVar82._0_8_ = uStack_2100;
          _local_2168 = vmaxps_avx(auVar30,auVar82 << 0x40);
          break;
        case 2:
          fVar94 = *(float *)*in_stack_00000030;
          auVar33._8_8_ = uStack_27e0;
          auVar33._0_8_ = local_27e8;
          auVar12 = vmaxps_avx(ZEXT816(0),auVar33);
          auVar34._8_8_ = uStack_27e0;
          auVar34._0_8_ = local_27e8;
          auVar10 = vminps_avx(ZEXT816(0),auVar34);
          local_1e18 = auVar10._0_4_;
          fStack_1e14 = auVar10._4_4_;
          fStack_1e10 = auVar10._8_4_;
          fStack_1e0c = auVar10._12_4_;
          local_1e28 = auVar12._0_4_;
          fStack_1e24 = auVar12._4_4_;
          fStack_1e20 = auVar12._8_4_;
          fStack_1e1c = auVar12._12_4_;
          local_2168._4_4_ = fStack_1e24 + fVar94 * fStack_1e14;
          local_2168._0_4_ = local_1e28 + fVar94 * local_1e18;
          uStack_2160._0_4_ = fStack_1e20 + fVar94 * fStack_1e10;
          uStack_2160._4_4_ = fStack_1e1c + fVar94 * fStack_1e0c;
          break;
        case 3:
          uVar6 = *(undefined4 *)*in_stack_00000030;
          auVar31._4_4_ = uVar6;
          auVar31._0_4_ = uVar6;
          auVar31._12_4_ = uVar6;
          auVar31._8_4_ = uVar6;
          uVar6 = *(undefined4 *)(*in_stack_00000030 + 4);
          auVar35._4_4_ = uVar6;
          auVar35._0_4_ = uVar6;
          auVar35._12_4_ = uVar6;
          auVar35._8_4_ = uVar6;
          auVar32._8_8_ = uStack_27e0;
          auVar32._0_8_ = local_27e8;
          auVar12 = vmaxps_avx(auVar32,auVar31);
          _local_2168 = vminps_avx(auVar12,auVar35);
          break;
        case 4:
          auVar36._8_8_ = 0x3f8000003f800000;
          auVar36._0_8_ = 0x3f8000003f800000;
          uStack_1cd0 = SUB168(ZEXT816(0),4);
          auVar83._8_8_ = 0;
          auVar83._0_8_ = uStack_1cd0;
          auVar45._8_8_ = uStack_27e0;
          auVar45._0_8_ = local_27e8;
          auVar12 = vsubps_avx(auVar83 << 0x40,auVar45);
          auVar44._8_8_ = 0x42b0c0a542b0c0a5;
          auVar44._0_8_ = 0x42b0c0a542b0c0a5;
          auVar12 = vminps_avx(auVar12,auVar44);
          auVar43._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar43._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar11 = vmaxps_avx(auVar12,auVar43);
          local_1298 = auVar11._0_4_;
          fStack_1294 = auVar11._4_4_;
          fStack_1290 = auVar11._8_4_;
          fStack_128c = auVar11._12_4_;
          fVar94 = local_1298 * 1.442695 + 0.5;
          fVar95 = fStack_1294 * 1.442695 + 0.5;
          fVar96 = fStack_1290 * 1.442695 + 0.5;
          fVar97 = fStack_128c * 1.442695 + 0.5;
          local_1648 = CONCAT44(fVar95,fVar94);
          uStack_1640._0_4_ = fVar96;
          uStack_1640._4_4_ = fVar97;
          local_1658 = CONCAT44((int)fVar95,(int)fVar94);
          uStack_1650._0_4_ = (int)fVar96;
          uStack_1650._4_4_ = (int)fVar97;
          auVar46._8_8_ = uStack_1650;
          auVar46._0_8_ = local_1658;
          auVar10 = vcvtdq2ps_avx(auVar46);
          auVar48._8_8_ = uStack_1640;
          auVar48._0_8_ = local_1648;
          auVar12 = vcmpps_avx(auVar48,auVar10,1);
          auVar50._8_8_ = 0x3f8000003f800000;
          auVar50._0_8_ = 0x3f8000003f800000;
          auVar12 = vpand_avx(auVar12,auVar50);
          auVar12 = vsubps_avx(auVar10,auVar12);
          local_1058 = auVar12._0_4_;
          fStack_1054 = auVar12._4_4_;
          fStack_1050 = auVar12._8_4_;
          fStack_104c = auVar12._12_4_;
          auVar53._4_4_ = fStack_1054 * 0.6933594;
          auVar53._0_4_ = local_1058 * 0.6933594;
          auVar53._8_4_ = fStack_1050 * 0.6933594;
          auVar53._12_4_ = fStack_104c * 0.6933594;
          auVar12 = vsubps_avx(auVar11,auVar53);
          auVar52._4_4_ = fStack_1054 * -0.00021219444;
          auVar52._0_4_ = local_1058 * -0.00021219444;
          auVar52._8_4_ = fStack_1050 * -0.00021219444;
          auVar52._12_4_ = fStack_104c * -0.00021219444;
          auVar12 = vsubps_avx(auVar12,auVar52);
          local_12b8 = auVar12._0_4_;
          fStack_12b4 = auVar12._4_4_;
          fStack_12b0 = auVar12._8_4_;
          fStack_12ac = auVar12._12_4_;
          local_1658 = CONCAT44((int)fStack_1054,(int)local_1058);
          uStack_1650._0_4_ = (int)fStack_1050;
          uStack_1650._4_4_ = (int)fStack_104c;
          auVar42._8_8_ = uStack_1650;
          auVar42._0_8_ = local_1658;
          auVar41._8_8_ = 0x7f0000007f;
          auVar41._0_8_ = 0x7f0000007f;
          auVar12 = vpaddd_avx(auVar42,auVar41);
          auVar12 = vpslld_avx(auVar12,ZEXT416(0x17));
          local_12e8 = auVar12._0_4_;
          fStack_12e4 = auVar12._4_4_;
          fStack_12e0 = auVar12._8_4_;
          fStack_12dc = auVar12._12_4_;
          auVar37._4_4_ =
               ((((((fStack_12b4 * 0.00019875691 + 0.0013981999) * fStack_12b4 + 0.008333452) *
                   fStack_12b4 + 0.041665796) * fStack_12b4 + 0.16666666) * fStack_12b4 + 0.5) *
                fStack_12b4 * fStack_12b4 + fStack_12b4 + 1.0) * fStack_12e4 + 1.0;
          auVar37._0_4_ =
               ((((((local_12b8 * 0.00019875691 + 0.0013981999) * local_12b8 + 0.008333452) *
                   local_12b8 + 0.041665796) * local_12b8 + 0.16666666) * local_12b8 + 0.5) *
                local_12b8 * local_12b8 + local_12b8 + 1.0) * local_12e8 + 1.0;
          auVar37._8_4_ =
               ((((((fStack_12b0 * 0.00019875691 + 0.0013981999) * fStack_12b0 + 0.008333452) *
                   fStack_12b0 + 0.041665796) * fStack_12b0 + 0.16666666) * fStack_12b0 + 0.5) *
                fStack_12b0 * fStack_12b0 + fStack_12b0 + 1.0) * fStack_12e0 + 1.0;
          auVar37._12_4_ =
               ((((((fStack_12ac * 0.00019875691 + 0.0013981999) * fStack_12ac + 0.008333452) *
                   fStack_12ac + 0.041665796) * fStack_12ac + 0.16666666) * fStack_12ac + 0.5) *
                fStack_12ac * fStack_12ac + fStack_12ac + 1.0) * fStack_12dc + 1.0;
          _local_2168 = vdivps_avx(auVar36,auVar37);
          break;
        case 5:
          auVar40._8_8_ = uStack_27e0;
          auVar40._0_8_ = local_27e8;
          auVar39._8_8_ = 0x42b0c0a542b0c0a5;
          auVar39._0_8_ = 0x42b0c0a542b0c0a5;
          auVar12 = vminps_avx(auVar40,auVar39);
          auVar38._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar11 = vmaxps_avx(auVar12,auVar38);
          local_16e8 = auVar11._0_4_;
          fStack_16e4 = auVar11._4_4_;
          fStack_16e0 = auVar11._8_4_;
          fStack_16dc = auVar11._12_4_;
          fVar94 = local_16e8 * 1.442695 + 0.5;
          fVar95 = fStack_16e4 * 1.442695 + 0.5;
          fVar96 = fStack_16e0 * 1.442695 + 0.5;
          fVar97 = fStack_16dc * 1.442695 + 0.5;
          local_1a98 = CONCAT44(fVar95,fVar94);
          uStack_1a90._0_4_ = fVar96;
          uStack_1a90._4_4_ = fVar97;
          local_1aa8 = CONCAT44((int)fVar95,(int)fVar94);
          uStack_1aa0._0_4_ = (int)fVar96;
          uStack_1aa0._4_4_ = (int)fVar97;
          auVar47._8_8_ = uStack_1aa0;
          auVar47._0_8_ = local_1aa8;
          auVar10 = vcvtdq2ps_avx(auVar47);
          auVar49._8_8_ = uStack_1a90;
          auVar49._0_8_ = local_1a98;
          auVar12 = vcmpps_avx(auVar49,auVar10,1);
          auVar51._8_8_ = 0x3f8000003f800000;
          auVar51._0_8_ = 0x3f8000003f800000;
          auVar12 = vpand_avx(auVar12,auVar51);
          auVar12 = vsubps_avx(auVar10,auVar12);
          local_f78 = auVar12._0_4_;
          fStack_f74 = auVar12._4_4_;
          fStack_f70 = auVar12._8_4_;
          fStack_f6c = auVar12._12_4_;
          auVar55._4_4_ = fStack_f74 * 0.6933594;
          auVar55._0_4_ = local_f78 * 0.6933594;
          auVar55._8_4_ = fStack_f70 * 0.6933594;
          auVar55._12_4_ = fStack_f6c * 0.6933594;
          auVar12 = vsubps_avx(auVar11,auVar55);
          auVar54._4_4_ = fStack_f74 * -0.00021219444;
          auVar54._0_4_ = local_f78 * -0.00021219444;
          auVar54._8_4_ = fStack_f70 * -0.00021219444;
          auVar54._12_4_ = fStack_f6c * -0.00021219444;
          auVar12 = vsubps_avx(auVar12,auVar54);
          local_1708 = auVar12._0_4_;
          fStack_1704 = auVar12._4_4_;
          fStack_1700 = auVar12._8_4_;
          fStack_16fc = auVar12._12_4_;
          local_1aa8 = CONCAT44((int)fStack_f74,(int)local_f78);
          uStack_1aa0._0_4_ = (int)fStack_f70;
          uStack_1aa0._4_4_ = (int)fStack_f6c;
          auVar13._8_8_ = uStack_1aa0;
          auVar13._0_8_ = local_1aa8;
          auVar11._8_8_ = 0x7f0000007f;
          auVar11._0_8_ = 0x7f0000007f;
          auVar12 = vpaddd_avx(auVar13,auVar11);
          auVar12 = vpslld_avx(auVar12,ZEXT416(0x17));
          local_1738 = auVar12._0_4_;
          fStack_1734 = auVar12._4_4_;
          fStack_1730 = auVar12._8_4_;
          fStack_172c = auVar12._12_4_;
          local_758 = CONCAT44(((((((fStack_1704 * 0.00019875691 + 0.0013981999) * fStack_1704 +
                                   0.008333452) * fStack_1704 + 0.041665796) * fStack_1704 +
                                 0.16666666) * fStack_1704 + 0.5) * fStack_1704 * fStack_1704 +
                                fStack_1704 + 1.0) * fStack_1734 + 1.0,
                               ((((((local_1708 * 0.00019875691 + 0.0013981999) * local_1708 +
                                   0.008333452) * local_1708 + 0.041665796) * local_1708 +
                                 0.16666666) * local_1708 + 0.5) * local_1708 * local_1708 +
                                local_1708 + 1.0) * local_1738 + 1.0);
          uStack_750._0_4_ =
               ((((((fStack_1700 * 0.00019875691 + 0.0013981999) * fStack_1700 + 0.008333452) *
                   fStack_1700 + 0.041665796) * fStack_1700 + 0.16666666) * fStack_1700 + 0.5) *
                fStack_1700 * fStack_1700 + fStack_1700 + 1.0) * fStack_1730 + 1.0;
          uStack_750._4_4_ =
               ((((((fStack_16fc * 0.00019875691 + 0.0013981999) * fStack_16fc + 0.008333452) *
                   fStack_16fc + 0.041665796) * fStack_16fc + 0.16666666) * fStack_16fc + 0.5) *
                fStack_16fc * fStack_16fc + fStack_16fc + 1.0) * fStack_172c + 1.0;
          uStack_700 = SUB168(ZEXT816(0),4);
          auVar78._8_8_ = uStack_750;
          auVar78._0_8_ = local_758;
          auVar84._8_8_ = 0;
          auVar84._0_8_ = uStack_700;
          auVar12 = vcmpps_avx(auVar78,auVar84 << 0x40,2);
          auVar71._8_8_ = uStack_750;
          auVar71._0_8_ = local_758;
          auVar70._8_8_ = 0x80000000800000;
          auVar70._0_8_ = 0x80000000800000;
          auVar10 = vmaxps_avx(auVar71,auVar70);
          auVar11 = vpsrld_avx(auVar10,ZEXT416(0x17));
          auVar75._8_8_ = 0x807fffff807fffff;
          auVar75._0_8_ = 0x807fffff807fffff;
          auVar10 = vpand_avx(auVar10,auVar75);
          auVar80._8_8_ = 0x3f0000003f000000;
          auVar80._0_8_ = 0x3f0000003f000000;
          auVar13 = vpor_avx(auVar10,auVar80);
          auVar69._8_8_ = 0x7f0000007f;
          auVar69._0_8_ = 0x7f0000007f;
          auVar10 = vpsubd_avx(auVar11,auVar69);
          auVar10 = vcvtdq2ps_avx(auVar10);
          local_388 = auVar10._0_4_;
          fStack_384 = auVar10._4_4_;
          fStack_380 = auVar10._8_4_;
          fStack_37c = auVar10._12_4_;
          local_798 = CONCAT44(fStack_384 + 1.0,local_388 + 1.0);
          uStack_790._0_4_ = fStack_380 + 1.0;
          uStack_790._4_4_ = fStack_37c + 1.0;
          auVar81._8_8_ = 0x3f3504f33f3504f3;
          auVar81._0_8_ = 0x3f3504f33f3504f3;
          auVar10 = vcmpps_avx(auVar13,auVar81,1);
          auVar11 = vpand_avx(auVar13,auVar10);
          auVar73._8_8_ = 0x3f8000003f800000;
          auVar73._0_8_ = 0x3f8000003f800000;
          auVar13 = vsubps_avx(auVar13,auVar73);
          auVar74._8_8_ = 0x3f8000003f800000;
          auVar74._0_8_ = 0x3f8000003f800000;
          auVar10 = vpand_avx(auVar74,auVar10);
          auVar72._8_8_ = uStack_790;
          auVar72._0_8_ = local_798;
          auVar10 = vsubps_avx(auVar72,auVar10);
          local_3a8 = auVar13._0_4_;
          fStack_3a4 = auVar13._4_4_;
          fStack_3a0 = auVar13._8_4_;
          fStack_39c = auVar13._12_4_;
          local_3b8 = auVar11._0_4_;
          fStack_3b4 = auVar11._4_4_;
          fStack_3b0 = auVar11._8_4_;
          fStack_3ac = auVar11._12_4_;
          local_3a8 = local_3a8 + local_3b8;
          fStack_3a4 = fStack_3a4 + fStack_3b4;
          fStack_3a0 = fStack_3a0 + fStack_3b0;
          fStack_39c = fStack_39c + fStack_3ac;
          local_268 = auVar10._0_4_;
          fStack_264 = auVar10._4_4_;
          fStack_260 = auVar10._8_4_;
          fStack_25c = auVar10._12_4_;
          local_7d8 = CONCAT44(fStack_264 * -0.00021219444 +
                               ((((((((fStack_3a4 * 0.070376836 + -0.1151461) * fStack_3a4 +
                                     0.116769984) * fStack_3a4 + -0.12420141) * fStack_3a4 +
                                   0.14249323) * fStack_3a4 + -0.16668057) * fStack_3a4 + 0.20000714
                                 ) * fStack_3a4 + -0.24999994) * fStack_3a4 + 0.3333333) *
                               fStack_3a4 * fStack_3a4 * fStack_3a4,
                               local_268 * -0.00021219444 +
                               ((((((((local_3a8 * 0.070376836 + -0.1151461) * local_3a8 +
                                     0.116769984) * local_3a8 + -0.12420141) * local_3a8 +
                                   0.14249323) * local_3a8 + -0.16668057) * local_3a8 + 0.20000714)
                                 * local_3a8 + -0.24999994) * local_3a8 + 0.3333333) * local_3a8 *
                               local_3a8 * local_3a8);
          uStack_7d0._0_4_ =
               fStack_260 * -0.00021219444 +
               ((((((((fStack_3a0 * 0.070376836 + -0.1151461) * fStack_3a0 + 0.116769984) *
                     fStack_3a0 + -0.12420141) * fStack_3a0 + 0.14249323) * fStack_3a0 + -0.16668057
                  ) * fStack_3a0 + 0.20000714) * fStack_3a0 + -0.24999994) * fStack_3a0 + 0.3333333)
               * fStack_3a0 * fStack_3a0 * fStack_3a0;
          uStack_7d0._4_4_ =
               fStack_25c * -0.00021219444 +
               ((((((((fStack_39c * 0.070376836 + -0.1151461) * fStack_39c + 0.116769984) *
                     fStack_39c + -0.12420141) * fStack_39c + 0.14249323) * fStack_39c + -0.16668057
                  ) * fStack_39c + 0.20000714) * fStack_39c + -0.24999994) * fStack_39c + 0.3333333)
               * fStack_39c * fStack_39c * fStack_39c;
          auVar77._8_8_ = uStack_7d0;
          auVar77._0_8_ = local_7d8;
          auVar76._4_4_ = fStack_3a4 * fStack_3a4 * 0.5;
          auVar76._0_4_ = local_3a8 * local_3a8 * 0.5;
          auVar76._8_4_ = fStack_3a0 * fStack_3a0 * 0.5;
          auVar76._12_4_ = fStack_39c * fStack_39c * 0.5;
          auVar10 = vsubps_avx(auVar77,auVar76);
          local_3d8 = auVar10._0_4_;
          fStack_3d4 = auVar10._4_4_;
          fStack_3d0 = auVar10._8_4_;
          fStack_3cc = auVar10._12_4_;
          local_758 = CONCAT44(fStack_264 * 0.6933594 + fStack_3a4 + fStack_3d4,
                               local_268 * 0.6933594 + local_3a8 + local_3d8);
          uStack_750._0_4_ = fStack_260 * 0.6933594 + fStack_3a0 + fStack_3d0;
          uStack_750._4_4_ = fStack_25c * 0.6933594 + fStack_39c + fStack_3cc;
          auVar79._8_8_ = uStack_750;
          auVar79._0_8_ = local_758;
          auVar12 = vpor_avx(auVar79,auVar12);
          local_ec8 = auVar12._0_4_;
          fStack_ec4 = auVar12._4_4_;
          fStack_ec0 = auVar12._8_4_;
          fStack_ebc = auVar12._12_4_;
          auVar62._4_4_ = fStack_ec4 * 2.0;
          auVar62._0_4_ = local_ec8 * 2.0;
          auVar62._12_4_ = fStack_ebc * 2.0;
          auVar62._8_4_ = fStack_ec0 * 2.0;
          auVar85._8_8_ = 0;
          auVar85._0_8_ = uStack_700;
          auVar12 = vsubps_avx(auVar85 << 0x40,auVar62);
          auVar61._8_8_ = 0x42b0c0a542b0c0a5;
          auVar61._0_8_ = 0x42b0c0a542b0c0a5;
          auVar12 = vminps_avx(auVar12,auVar61);
          auVar60._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar60._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar11 = vmaxps_avx(auVar12,auVar60);
          local_9e8 = auVar11._0_4_;
          fStack_9e4 = auVar11._4_4_;
          fStack_9e0 = auVar11._8_4_;
          fStack_9dc = auVar11._12_4_;
          fVar94 = local_9e8 * 1.442695 + 0.5;
          fVar95 = fStack_9e4 * 1.442695 + 0.5;
          fVar96 = fStack_9e0 * 1.442695 + 0.5;
          fVar97 = fStack_9dc * 1.442695 + 0.5;
          local_d98 = CONCAT44(fVar95,fVar94);
          uStack_d90._0_4_ = fVar96;
          uStack_d90._4_4_ = fVar97;
          local_da8 = CONCAT44((int)fVar95,(int)fVar94);
          uStack_da0._0_4_ = (int)fVar96;
          uStack_da0._4_4_ = (int)fVar97;
          auVar64._8_8_ = uStack_da0;
          auVar64._0_8_ = local_da8;
          auVar10 = vcvtdq2ps_avx(auVar64);
          auVar65._8_8_ = uStack_d90;
          auVar65._0_8_ = local_d98;
          auVar12 = vcmpps_avx(auVar65,auVar10,1);
          auVar66._8_8_ = 0x3f8000003f800000;
          auVar66._0_8_ = 0x3f8000003f800000;
          auVar12 = vpand_avx(auVar12,auVar66);
          auVar12 = vsubps_avx(auVar10,auVar12);
          local_818 = auVar12._0_4_;
          fStack_814 = auVar12._4_4_;
          fStack_810 = auVar12._8_4_;
          fStack_80c = auVar12._12_4_;
          auVar68._4_4_ = fStack_814 * 0.6933594;
          auVar68._0_4_ = local_818 * 0.6933594;
          auVar68._8_4_ = fStack_810 * 0.6933594;
          auVar68._12_4_ = fStack_80c * 0.6933594;
          auVar12 = vsubps_avx(auVar11,auVar68);
          auVar67._4_4_ = fStack_814 * -0.00021219444;
          auVar67._0_4_ = local_818 * -0.00021219444;
          auVar67._8_4_ = fStack_810 * -0.00021219444;
          auVar67._12_4_ = fStack_80c * -0.00021219444;
          auVar12 = vsubps_avx(auVar12,auVar67);
          local_a08 = auVar12._0_4_;
          fStack_a04 = auVar12._4_4_;
          fStack_a00 = auVar12._8_4_;
          fStack_9fc = auVar12._12_4_;
          local_da8 = CONCAT44((int)fStack_814,(int)local_818);
          uStack_da0._0_4_ = (int)fStack_810;
          uStack_da0._4_4_ = (int)fStack_80c;
          auVar59._8_8_ = uStack_da0;
          auVar59._0_8_ = local_da8;
          auVar58._8_8_ = 0x7f0000007f;
          auVar58._0_8_ = 0x7f0000007f;
          auVar12 = vpaddd_avx(auVar59,auVar58);
          auVar12 = vpslld_avx(auVar12,ZEXT416(0x17));
          local_a38 = auVar12._0_4_;
          fStack_a34 = auVar12._4_4_;
          fStack_a30 = auVar12._8_4_;
          fStack_a2c = auVar12._12_4_;
          auVar57._8_8_ = 0x3f8000003f800000;
          auVar57._0_8_ = 0x3f8000003f800000;
          auVar56._4_4_ =
               (((((fStack_a04 * (fStack_a04 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_a04 + 0.041665796) * fStack_a04 + 0.16666666) * fStack_a04 + 0.5) *
                fStack_a04 * fStack_a04 + fStack_a04 + 1.0) * fStack_a34 + 1.0;
          auVar56._0_4_ =
               (((((local_a08 * (local_a08 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   local_a08 + 0.041665796) * local_a08 + 0.16666666) * local_a08 + 0.5) *
                local_a08 * local_a08 + local_a08 + 1.0) * local_a38 + 1.0;
          auVar56._8_4_ =
               (((((fStack_a00 * (fStack_a00 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_a00 + 0.041665796) * fStack_a00 + 0.16666666) * fStack_a00 + 0.5) *
                fStack_a00 * fStack_a00 + fStack_a00 + 1.0) * fStack_a30 + 1.0;
          auVar56._12_4_ =
               (((((fStack_9fc * (fStack_9fc * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_9fc + 0.041665796) * fStack_9fc + 0.16666666) * fStack_9fc + 0.5) *
                fStack_9fc * fStack_9fc + fStack_9fc + 1.0) * fStack_a2c + 1.0;
          auVar12 = vdivps_avx(auVar57,auVar56);
          local_ee8 = auVar12._0_4_;
          fStack_ee4 = auVar12._4_4_;
          fStack_ee0 = auVar12._8_4_;
          fStack_edc = auVar12._12_4_;
          auVar98._0_4_ = local_ee8 * 2.0;
          auVar98._4_4_ = fStack_ee4 * 2.0;
          auVar98._8_4_ = fStack_ee0 * 2.0;
          auVar98._12_4_ = fStack_edc * 2.0;
          auVar63._8_8_ = 0x3f8000003f800000;
          auVar63._0_8_ = 0x3f8000003f800000;
          auVar12 = vsubps_avx(auVar98,auVar63);
          local_1c58 = auVar12._0_4_;
          fStack_1c54 = auVar12._4_4_;
          fStack_1c50 = auVar12._8_4_;
          fStack_1c4c = auVar12._12_4_;
          local_2168._4_4_ = fStack_1ba4 * fStack_1c54;
          local_2168._0_4_ = local_1ba8 * local_1c58;
          uStack_2160._0_4_ = fStack_1c40 * fStack_1c50;
          uStack_2160._4_4_ = fStack_1c3c * fStack_1c4c;
          break;
        case 6:
          fVar94 = *(float *)*in_stack_00000030;
          fVar95 = *(float *)(*in_stack_00000030 + 4);
          local_1c08 = CONCAT44(fStack_1ba4 * fVar94 + fVar95,local_1ba8 * fVar94 + fVar95);
          uStack_1c00._0_4_ = fStack_1c40 * fVar94 + fVar95;
          uStack_1c00._4_4_ = fStack_1c3c * fVar94 + fVar95;
          auVar12._8_8_ = uStack_1c00;
          auVar12._0_8_ = local_1c08;
          auVar12 = vmaxps_avx(auVar12,ZEXT816(0));
          auVar10._8_8_ = 0x3f8000003f800000;
          auVar10._0_8_ = 0x3f8000003f800000;
          auVar12 = vminps_avx(auVar12,auVar10);
          local_1b98 = auVar12._0_4_;
          fStack_1b94 = auVar12._4_4_;
          fStack_1b90 = auVar12._8_4_;
          fStack_1b8c = auVar12._12_4_;
          local_2168._4_4_ = fStack_1b94 * fStack_1ba4;
          local_2168._0_4_ = local_1b98 * local_1ba8;
          uStack_2160._0_4_ = fStack_1b90 * fStack_1c40;
          uStack_2160._4_4_ = fStack_1b8c * fStack_1c3c;
          break;
        default:
          uStack_2160 = uStack_27e0;
          local_2168 = (undefined1  [8])local_27e8;
        }
        *local_2760 = local_2168;
        local_2760[1] = uStack_2160;
        local_2760 = local_2760 + 2;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack8to4_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128 _sum = _mm_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm_loadu_ps(bias_data_ptr + p * 4);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 8;

                            int k = (y * kernel_w + x) * 32;

                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);
                            __m128 _w0 = _mm_load_ps(kptr + k);
                            __m128 _w1 = _mm_load_ps(kptr + k + 4);
                            __m128 _w2 = _mm_load_ps(kptr + k + 8);
                            __m128 _w3 = _mm_load_ps(kptr + k + 12);
                            __m128 _w4 = _mm_load_ps(kptr + k + 16);
                            __m128 _w5 = _mm_load_ps(kptr + k + 20);
                            __m128 _w6 = _mm_load_ps(kptr + k + 24);
                            __m128 _w7 = _mm_load_ps(kptr + k + 28);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);
                        }
                    }

                    kptr += maxk * 32;
                }

                _sum = activation_sse(_sum, activation_type, activation_params);

                _mm_storeu_ps(outptr, _sum);
                outptr += 4;
            }
        }
    }
}